

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O1

string * __thiscall
JointActionObservationHistory::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,JointActionObservationHistory *this)

{
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  char *pcVar5;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (this->_m_pred != (JointActionObservationHistory *)0x0) {
    if ((this->super_JointHistory).super_History._m_length == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"JointActionObservationHistory:Print() -Warning:_m_pred != ",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"null, but lenght <= 1 !",0x17);
      std::endl<char,std::char_traits<char>>(local_198);
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar3 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      __cxa_throw(puVar3,&E::typeinfo,E::~E);
    }
    SoftPrint_abi_cxx11_(&local_1c8,this->_m_pred);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_198,", ",2);
  }
  if ((this->super_JointHistory).super_History._m_length == 0) {
    lVar4 = 7;
    pcVar5 = "<EMPTY>";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"< ",2);
    pMVar1 = this->_m_planningUnitMADPDiscrete->_m_madp;
    plVar2 = (long *)(**(code **)((long)*pMVar1 + 0x80))(pMVar1,this->_m_jaI);
    (**(code **)(*plVar2 + 0x20))(&local_1c8,plVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_198,", ",2);
    pMVar1 = this->_m_planningUnitMADPDiscrete->_m_madp;
    plVar2 = (long *)(**(code **)((long)*pMVar1 + 0xd8))(pMVar1,this->_m_joI);
    (**(code **)(*plVar2 + 0x20))(&local_1c8,plVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    lVar4 = 2;
    pcVar5 = " >";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar5,lVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string JointActionObservationHistory::SoftPrint() const
{
    stringstream ss;
    if(_m_pred != 0)
    {
        if(_m_length >= 1)
        {
            ss << _m_pred->SoftPrint();
            ss << ", ";
        }
        else
        {
            ss << "JointActionObservationHistory:Print() -Warning:_m_pred != "
                << "null, but lenght <= 1 !"<<endl;
            throw E(ss);
        }
    }

    if (_m_length >= 1) 
    {
        ss << "< ";    
        ss << _m_planningUnitMADPDiscrete->GetJointAction(_m_jaI)->SoftPrintBrief();
        ss << ", ";    
        ss << _m_planningUnitMADPDiscrete->GetJointObservation(_m_joI)->SoftPrintBrief();
        ss << " >";    
    }
    else
        ss << "<EMPTY>";


    return(ss.str());

}